

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_log_encode(hdr_histogram *histogram,char **encoded_histogram)

{
  int iVar1;
  size_t output_len;
  size_t encoded_len;
  int result;
  int rc;
  size_t compressed_len;
  uint8_t *compressed_histogram;
  char *encoded_histogram_tmp;
  char **encoded_histogram_local;
  hdr_histogram *histogram_local;
  
  compressed_histogram = (uint8_t *)0x0;
  compressed_len = 0;
  _result = 0;
  encoded_len._0_4_ = 0;
  encoded_histogram_tmp = (char *)encoded_histogram;
  encoded_histogram_local = (char **)histogram;
  iVar1 = hdr_encode_compressed(histogram,(uint8_t **)&compressed_len,(size_t *)&result);
  if (iVar1 == 0) {
    output_len = hdr_base64_encoded_len(_result);
    compressed_histogram = (uint8_t *)calloc(output_len + 1,1);
    iVar1 = hdr_base64_encode((uint8_t *)compressed_len,_result,(char *)compressed_histogram,
                              output_len);
    if (iVar1 == 0) {
      *(uint8_t **)encoded_histogram_tmp = compressed_histogram;
      iVar1 = (int)encoded_len;
    }
    else {
      free(compressed_histogram);
    }
  }
  encoded_len._0_4_ = iVar1;
  free((void *)compressed_len);
  return (int)encoded_len;
}

Assistant:

int hdr_log_encode(struct hdr_histogram* histogram, char** encoded_histogram)
{
    char *encoded_histogram_tmp = NULL;
    uint8_t* compressed_histogram = NULL;
    size_t compressed_len = 0;
    int rc = 0;
    int result = 0;
    size_t encoded_len;

    rc = hdr_encode_compressed(histogram, &compressed_histogram, &compressed_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    encoded_len = hdr_base64_encoded_len(compressed_len);
    encoded_histogram_tmp = (char*) hdr_calloc(encoded_len + 1, sizeof(char));

    rc = hdr_base64_encode(
        compressed_histogram, compressed_len, encoded_histogram_tmp, encoded_len);
    if (rc != 0)
    {
        hdr_free(encoded_histogram_tmp);
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    *encoded_histogram = encoded_histogram_tmp;

cleanup:
    hdr_free(compressed_histogram);

    return result;
}